

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O3

void duckdb::StructStats::Serialize(BaseStatistics *stats,Serializer *serializer)

{
  BaseStatistics *this;
  idx_t iVar1;
  
  this = GetChildStats(stats);
  iVar1 = StructType::GetChildCount(&stats->type);
  (*serializer->_vptr_Serializer[2])(serializer,200,"child_stats");
  (*serializer->_vptr_Serializer[8])(serializer,iVar1);
  for (; iVar1 != 0; iVar1 = iVar1 - 1) {
    (*serializer->_vptr_Serializer[6])(serializer);
    BaseStatistics::Serialize(this,serializer);
    (*serializer->_vptr_Serializer[7])(serializer);
    this = this + 1;
  }
  (*serializer->_vptr_Serializer[9])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void StructStats::Serialize(const BaseStatistics &stats, Serializer &serializer) {
	auto child_stats = StructStats::GetChildStats(stats);
	auto child_count = StructType::GetChildCount(stats.GetType());

	serializer.WriteList(200, "child_stats", child_count,
	                     [&](Serializer::List &list, idx_t i) { list.WriteElement(child_stats[i]); });
}